

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::Vec3>
          (BinBinaryReader *this,Vec3 *value)

{
  char **ppcVar1;
  ulong *pos;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  
  pos = (ulong *)(this->reader).cur_;
  pcVar2 = (this->reader).cap_;
  if (pcVar2 < (char *)((long)pos + 0xcU)) {
    bVar3 = fail_msg(this,"reader.read(value.value)",(char *)pos);
    uVar4 = (ulong)bVar3;
  }
  else {
    (value->value)._M_elems[2] = *(float *)(pos + 1);
    uVar4 = *pos;
    *(ulong *)(value->value)._M_elems = uVar4;
    ppcVar1 = &(this->reader).cur_;
    *ppcVar1 = *ppcVar1 + 0xc;
  }
  return (bool)((char *)((long)pos + 0xcU) <= pcVar2 | (byte)uVar4 & 1);
}

Assistant:

bool read(std::array<T, SIZE>& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) * SIZE > cap_) {
                return false;
            }
            memcpy(value.data(), cur_, sizeof(T) * SIZE);
            cur_ += sizeof(T) * SIZE;
            return true;
        }